

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

size_t coda_base58_encode_alloc(char *in,size_t inlen,char **out)

{
  ulong uVar1;
  char *out_00;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = inlen * 0x8a;
  for (sVar2 = 0; (sVar3 = inlen, inlen != sVar2 && (sVar3 = sVar2, in[sVar2] == '\0'));
      sVar2 = sVar2 + 1) {
    uVar1 = uVar1 - 0x8a;
  }
  sVar2 = uVar1 / 100 + sVar3 + 2;
  out_00 = (char *)malloc(sVar2);
  *out = out_00;
  if (out_00 != (char *)0x0) {
    coda_base58_encode(in,inlen,out_00,sVar2);
    sVar2 = uVar1 / 100 + sVar3 + 1;
  }
  return sVar2;
}

Assistant:

size_t coda_base58_encode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t nonzero_inlen = inlen;
    while (nonzero_inlen && !in[zeroes])
    {
        zeroes++;
        nonzero_inlen--;
    }

    size_t outlen = zeroes + nonzero_inlen * 138 / 100 + 2;

    *out = malloc (outlen);
    if (!*out)
        return outlen;

    coda_base58_encode (in, inlen, *out, outlen);
    return outlen - 1;
}